

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.cpp
# Opt level: O1

void warning_report(string *message)

{
  ostream *poVar1;
  
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'h');
  std::ostream::put('h');
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"WARNING!\t",9);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(message->_M_dataplus)._M_p,message->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  warning_count = warning_count + 1;
  return;
}

Assistant:

void warning_report(std::string message)
{
	std::cerr << std::endl << "WARNING!\t" << message << std::endl;
	warning_count++;
}